

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void x11_keyboard_handle_key(XEvent *event)

{
  long lVar1;
  char *pcVar2;
  XEvent *event_local;
  
  lVar1 = XLookupKeysym(event,0);
  if (lVar1 == 0x20) {
    animate = (int)((animate != 0 ^ 0xffU) & 1);
    redisplay = (int)(animate != 0);
  }
  else {
    if (lVar1 == 0x74) {
      pcVar2 = getenv("NO_TEXTURE");
      if (pcVar2 == (char *)0x0) {
        setenv("NO_TEXTURE","1",1);
      }
      else {
        unsetenv("NO_TEXTURE");
      }
    }
    else {
      if (lVar1 == 0xff1b) {
        sighandler(0xf);
        return;
      }
      if (lVar1 == 0xff51) {
        view_ry = view_ry + 5.0;
      }
      else if (lVar1 == 0xff52) {
        view_rx = view_rx + 5.0;
      }
      else if (lVar1 == 0xff53) {
        view_ry = view_ry - 5.0;
      }
      else if (lVar1 == 0xff54) {
        view_rx = view_rx - 5.0;
      }
      else if (lVar1 == 0xff55) {
        view_tz = view_tz + -5.0;
      }
      else {
        if (lVar1 != 0xff56) {
          return;
        }
        view_tz = view_tz - -5.0;
      }
    }
    if (animate == 0) {
      redisplay = 1;
    }
  }
  return;
}

Assistant:

static void x11_keyboard_handle_key(XEvent *event)
{
  switch (XLookupKeysym(&event->xkey, 0)) {
    case XK_Escape:
      sighandler(SIGTERM);
      return;
    case XK_space:
      animate = !animate;
      if (animate) {
        redisplay = 1;
      }
      else {
        redisplay = 0;
      }
      return;
    case XK_Page_Down:
      view_tz -= -5.0;
      break;
    case XK_Page_Up:
      view_tz += -5.0;
      break;
    case XK_Down:
      view_rx -= 5.0;
      break;
    case XK_Up:
      view_rx += 5.0;
      break;
    case XK_Right:
      view_ry -= 5.0;
      break;
    case XK_Left:
      view_ry += 5.0;
      break;
    case XK_t:
      if (getenv("NO_TEXTURE")) {
        unsetenv("NO_TEXTURE");
      }
      else {
        setenv("NO_TEXTURE", "1", 1);
      }
      break;
    default:
      return;
  }

  if (!animate) {
    redisplay = 1;
  }
}